

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::internal::MatcherBase<const_std::vector<int,_std::allocator<int>_>_&>::~MatcherBase
          (MatcherBase<const_std::vector<int,_std::allocator<int>_>_&> *this)

{
  MatcherBase<const_std::vector<int,_std::allocator<int>_>_&> *this_local;
  
  (this->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00a134e0;
  Destroy(this);
  MatcherDescriberInterface::~MatcherDescriberInterface(&this->super_MatcherDescriberInterface);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }